

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int16 *
ma_dr_wav__read_pcm_frames_and_close_s16
          (ma_dr_wav *pWav,uint *channels,uint *sampleRate,ma_uint64 *totalFrameCount)

{
  ma_dr_wav *pWav_00;
  void *p;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  ma_uint64 framesRead;
  ma_int16 *pSampleData;
  ma_uint64 sampleDataSize;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  ma_uint64 in_stack_ffffffffffffffc0;
  ma_dr_wav *in_stack_fffffffffffffff8;
  
  pWav_00 = (ma_dr_wav *)
            ma_dr_wav__malloc_from_callbacks
                      ((size_t)in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x1fd1b9);
  if (pWav_00 == (ma_dr_wav *)0x0) {
    ma_dr_wav_uninit(in_stack_fffffffffffffff8);
    pWav_00 = (ma_dr_wav *)0x0;
  }
  else {
    p = (void *)ma_dr_wav_read_pcm_frames_s16
                          (pWav_00,in_stack_ffffffffffffffc0,(ma_int16 *)in_stack_ffffffffffffffb8);
    if (p == *(void **)(in_RDI + 0x78)) {
      ma_dr_wav_uninit(in_stack_fffffffffffffff8);
      if (in_RDX != (undefined4 *)0x0) {
        *in_RDX = *(undefined4 *)(in_RDI + 0x6c);
      }
      if (in_RSI != (uint *)0x0) {
        *in_RSI = (uint)*(ushort *)(in_RDI + 0x70);
      }
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = *(undefined8 *)(in_RDI + 0x78);
      }
    }
    else {
      ma_dr_wav__free_from_callbacks(p,in_stack_ffffffffffffffb8);
      ma_dr_wav_uninit(in_stack_fffffffffffffff8);
      pWav_00 = (ma_dr_wav *)0x0;
    }
  }
  return (ma_int16 *)pWav_00;
}

Assistant:

MA_PRIVATE ma_int16* ma_dr_wav__read_pcm_frames_and_close_s16(ma_dr_wav* pWav, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalFrameCount)
{
    ma_uint64 sampleDataSize;
    ma_int16* pSampleData;
    ma_uint64 framesRead;
    MA_DR_WAV_ASSERT(pWav != NULL);
    sampleDataSize = pWav->totalPCMFrameCount * pWav->channels * sizeof(ma_int16);
    if (sampleDataSize > MA_SIZE_MAX) {
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    pSampleData = (ma_int16*)ma_dr_wav__malloc_from_callbacks((size_t)sampleDataSize, &pWav->allocationCallbacks);
    if (pSampleData == NULL) {
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    framesRead = ma_dr_wav_read_pcm_frames_s16(pWav, (size_t)pWav->totalPCMFrameCount, pSampleData);
    if (framesRead != pWav->totalPCMFrameCount) {
        ma_dr_wav__free_from_callbacks(pSampleData, &pWav->allocationCallbacks);
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    ma_dr_wav_uninit(pWav);
    if (sampleRate) {
        *sampleRate = pWav->sampleRate;
    }
    if (channels) {
        *channels = pWav->channels;
    }
    if (totalFrameCount) {
        *totalFrameCount = pWav->totalPCMFrameCount;
    }
    return pSampleData;
}